

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallExportGenerator::TempDirCalculate_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallExportGenerator *this)

{
  string *a;
  string_view input;
  cmCryptoHash hasher;
  string local_30;
  
  a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[19]>
            (__return_storage_ptr__,a,(char (*) [19])"/CMakeFiles/Export");
  if ((this->super_cmInstallGenerator).Destination._M_string_length != 0) {
    cmCryptoHash::cmCryptoHash(&hasher,AlgoMD5);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    input._M_str = (this->super_cmInstallGenerator).Destination._M_dataplus._M_p;
    input._M_len = (this->super_cmInstallGenerator).Destination._M_string_length;
    cmCryptoHash::HashString_abi_cxx11_(&local_30,&hasher,input);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_30);
    cmCryptoHash::~cmCryptoHash(&hasher);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallExportGenerator::TempDirCalculate() const
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  std::string path = cmStrCat(
    this->LocalGenerator->GetCurrentBinaryDirectory(), "/CMakeFiles/Export");
  if (this->Destination.empty()) {
    return path;
  }

  cmCryptoHash hasher(cmCryptoHash::AlgoMD5);
  path += '/';
  // Replace the destination path with a hash to keep it short.
  path += hasher.HashString(this->Destination);

  return path;
}